

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O0

void __thiscall vkt::sr::anon_unknown_0::ShaderMatrixCase::setupShader(ShaderMatrixCase *this)

{
  string *__s;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  OperationNature OVar5;
  OperationType OVar6;
  char *pcVar7;
  ostream *poVar8;
  reference pbVar9;
  int precision;
  char *local_9b8;
  char *local_900;
  string *local_828;
  ShaderInput *local_810;
  int local_7f4;
  DataType local_7ec;
  DataType local_7e8;
  ostream *local_7a8;
  string local_798 [32];
  string local_778 [32];
  string local_758;
  string local_738;
  string local_718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6e8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6e0;
  const_iterator copyIter;
  allocator<char> local_6b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  Matrix<float,_4,_4> local_66c;
  Matrix<float,_3,_4> local_62c;
  Matrix<float,_2,_4> local_5fc;
  Matrix<float,_4,_3> local_5dc;
  Matrix<float,_3,_3> local_5ac;
  Matrix<float,_2,_3> local_588;
  Matrix<float,_4,_2> local_570;
  Matrix<float,_3,_2> local_550;
  Matrix<float,_2,_2> local_538;
  string local_528;
  string local_508;
  allocator<char> local_4e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  allocator<char> local_499;
  value_type local_498;
  allocator<char> local_471;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  allocator<char> local_429;
  value_type local_428;
  string *local_408;
  string *inValue;
  char *typeName;
  char *precName;
  ShaderInput *in;
  int local_3e0;
  int inNdx;
  deUint32 padding;
  deUint32 uniformBinding;
  DataType local_3d0;
  DataType otherType;
  DataType matrixType;
  int matNdx;
  string operationValue1;
  string operationValue0;
  undefined1 local_380 [4];
  int numInputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passVars;
  Precision resultPrec;
  DataType resultType;
  string inValue1;
  string inValue0;
  bool isInDynMat1;
  bool isInDynMat0;
  ostringstream *op;
  ostringstream local_300 [8];
  ostringstream frag;
  ostringstream local_188 [8];
  ostringstream vtx;
  ShaderMatrixCase *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__cxx11::ostringstream::ostringstream(local_300);
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    local_7a8 = (ostream *)local_300;
  }
  else {
    local_7a8 = (ostream *)local_188;
  }
  glu::isDataTypeMatrix((this->m_in0).dataType);
  glu::isDataTypeMatrix((this->m_in1).dataType);
  std::__cxx11::string::string((string *)(inValue1.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&resultPrec);
  passVars.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = TYPE_LAST;
  passVars.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (this->m_in0).precision;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_380);
  bVar1 = MatrixCaseUtils::isOperationBinary(this->m_op);
  iVar2 = 1;
  if (bVar1) {
    iVar2 = 2;
  }
  std::__cxx11::string::string((string *)(operationValue1.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&matrixType);
  if (((this->m_op == OP_MUL) && (bVar1 = glu::isDataTypeMatrix((this->m_in0).dataType), bVar1)) &&
     (bVar1 = glu::isDataTypeMatrix((this->m_in1).dataType), bVar1)) {
    iVar3 = glu::getDataTypeMatrixNumColumns((this->m_in1).dataType);
    iVar4 = glu::getDataTypeMatrixNumRows((this->m_in0).dataType);
    passVars.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = glu::getDataTypeMatrix(iVar3,iVar4);
  }
  else if (this->m_op == OP_OUTER_PRODUCT) {
    iVar3 = glu::getDataTypeScalarSize((this->m_in1).dataType);
    iVar4 = glu::getDataTypeScalarSize((this->m_in0).dataType);
    passVars.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = glu::getDataTypeMatrix(iVar3,iVar4);
  }
  else if (this->m_op == OP_TRANSPOSE) {
    iVar3 = glu::getDataTypeMatrixNumRows((this->m_in0).dataType);
    iVar4 = glu::getDataTypeMatrixNumColumns((this->m_in0).dataType);
    passVars.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = glu::getDataTypeMatrix(iVar3,iVar4);
  }
  else if (this->m_op == OP_INVERSE) {
    passVars.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (this->m_in0).dataType;
  }
  else if (this->m_op == OP_DETERMINANT) {
    passVars.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = TYPE_FLOAT;
  }
  else {
    OVar6 = MatrixCaseUtils::getOperationType(this->m_op);
    if ((OVar6 == OPERATIONTYPE_UNARY_PREFIX_OPERATOR) ||
       (OVar6 = MatrixCaseUtils::getOperationType(this->m_op),
       OVar6 == OPERATIONTYPE_UNARY_POSTFIX_OPERATOR)) {
      passVars.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (this->m_in0).dataType;
    }
    else {
      bVar1 = glu::isDataTypeMatrix((this->m_in0).dataType);
      if ((bVar1) && (bVar1 = glu::isDataTypeMatrix((this->m_in1).dataType), bVar1)) {
        passVars.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (this->m_in0).dataType;
      }
      else {
        bVar1 = glu::isDataTypeMatrix((this->m_in0).dataType);
        if ((bVar1) || (bVar1 = glu::isDataTypeMatrix((this->m_in1).dataType), bVar1)) {
          bVar1 = glu::isDataTypeMatrix((this->m_in0).dataType);
          otherType = (DataType)!bVar1;
          if (otherType == TYPE_INVALID) {
            local_7e8 = (this->m_in0).dataType;
          }
          else {
            local_7e8 = (this->m_in1).dataType;
          }
          local_3d0 = local_7e8;
          if (otherType == TYPE_INVALID) {
            local_7ec = (this->m_in1).dataType;
          }
          else {
            local_7ec = (this->m_in0).dataType;
          }
          uniformBinding = local_7ec;
          if (local_7ec == TYPE_FLOAT) {
            passVars.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_7e8;
          }
          else {
            if (otherType == TYPE_INVALID) {
              local_7f4 = glu::getDataTypeMatrixNumRows(local_7e8);
            }
            else {
              local_7f4 = glu::getDataTypeMatrixNumColumns(local_7e8);
            }
            passVars.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 glu::getDataTypeFloatVec(local_7f4);
          }
        }
      }
    }
  }
  if ((sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::
                                   header_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_,
               "#version 310 es\n",(allocator<char> *)((long)&padding + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&padding + 3));
    __cxa_atexit(std::__cxx11::string::~string,
                 &sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::
                         header_abi_cxx11_);
  }
  std::operator<<((ostream *)local_188,
                  (string *)
                  &sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_);
  std::operator<<((ostream *)local_300,
                  (string *)
                  &sr::(anonymous_namespace)::ShaderMatrixCase::setupShader()::header_abi_cxx11_);
  std::operator<<((ostream *)local_188,"layout(location = 0) in highp vec4 a_position;\n");
  std::operator<<((ostream *)local_300,"layout(location = 0) out mediump vec4 dEQP_FragColor;\n");
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
    std::operator<<((ostream *)local_188,"layout(location = 0) out mediump vec4 v_color;\n");
    std::operator<<((ostream *)local_300,"layout(location = 0) in mediump vec4 v_color;\n");
  }
  inNdx = 0;
  local_3e0 = 0;
  for (in._4_4_ = 0; in._4_4_ < iVar2; in._4_4_ = in._4_4_ + 1) {
    if (in._4_4_ < 1) {
      local_810 = &this->m_in0;
    }
    else {
      local_810 = &this->m_in1;
    }
    precName = (char *)local_810;
    typeName = glu::getPrecisionName(local_810->precision);
    inValue = (string *)glu::getDataTypeName(*(DataType *)(precName + 4));
    if (in._4_4_ < 1) {
      local_828 = (string *)((long)&inValue1.field_2 + 8);
    }
    else {
      local_828 = (string *)&resultPrec;
    }
    local_408 = local_828;
    if (*(int *)precName == 2) {
      bVar1 = glu::isDataTypeMatrix(*(DataType *)(precName + 4));
      if (bVar1) {
        poVar8 = std::operator<<((ostream *)local_188,"layout(location = ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,in._4_4_ + 4 + local_3e0);
        poVar8 = std::operator<<(poVar8,") in ");
        poVar8 = std::operator<<(poVar8,typeName);
        poVar8 = std::operator<<(poVar8," ");
        poVar8 = std::operator<<(poVar8,(char *)inValue);
        std::operator<<(poVar8," a_");
        poVar8 = std::operator<<((ostream *)local_188,(char *)inValue);
        std::operator<<(poVar8,";\n");
        if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
          poVar8 = std::operator<<((ostream *)local_188,"layout(location = ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,in._4_4_ + 1 + local_3e0);
          poVar8 = std::operator<<(poVar8,") out ");
          poVar8 = std::operator<<(poVar8,typeName);
          poVar8 = std::operator<<(poVar8," ");
          poVar8 = std::operator<<(poVar8,(char *)inValue);
          poVar8 = std::operator<<(poVar8," v_");
          poVar8 = std::operator<<(poVar8,(char *)inValue);
          std::operator<<(poVar8,";\n");
          poVar8 = std::operator<<((ostream *)local_300,"layout(location = ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,in._4_4_ + 1 + local_3e0);
          poVar8 = std::operator<<(poVar8,") in ");
          poVar8 = std::operator<<(poVar8,typeName);
          poVar8 = std::operator<<(poVar8," ");
          poVar8 = std::operator<<(poVar8,(char *)inValue);
          poVar8 = std::operator<<(poVar8," v_");
          poVar8 = std::operator<<(poVar8,(char *)inValue);
          std::operator<<(poVar8,";\n");
          __s = inValue;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_428,(char *)__s,&local_429);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_380,&local_428);
          std::__cxx11::string::~string((string *)&local_428);
          std::allocator<char>::~allocator(&local_429);
        }
        if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
          local_900 = "v_";
        }
        else {
          local_900 = "a_";
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_470,local_900,&local_471);
        pcVar7 = glu::getDataTypeName(*(DataType *)(precName + 4));
        std::operator+(&local_450,&local_470,pcVar7);
        std::__cxx11::string::operator=(local_408,(string *)&local_450);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)&local_470);
        std::allocator<char>::~allocator(&local_471);
        iVar3 = glu::getDataTypeMatrixNumColumns(*(DataType *)(precName + 4));
        local_3e0 = iVar3 + local_3e0;
      }
      else {
        poVar8 = std::operator<<((ostream *)local_188,"layout(location = 1) in ");
        poVar8 = std::operator<<(poVar8,typeName);
        poVar8 = std::operator<<(poVar8," ");
        poVar8 = std::operator<<(poVar8,(char *)inValue);
        std::operator<<(poVar8," a_coords;\n");
        if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
          poVar8 = std::operator<<((ostream *)local_188,"layout(location = ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_3e0 + 1);
          poVar8 = std::operator<<(poVar8,") out ");
          poVar8 = std::operator<<(poVar8,typeName);
          poVar8 = std::operator<<(poVar8," ");
          poVar8 = std::operator<<(poVar8,(char *)inValue);
          std::operator<<(poVar8," v_coords;\n");
          poVar8 = std::operator<<((ostream *)local_300,"layout(location = ");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_3e0 + 1);
          poVar8 = std::operator<<(poVar8,") in ");
          poVar8 = std::operator<<(poVar8,typeName);
          poVar8 = std::operator<<(poVar8," ");
          poVar8 = std::operator<<(poVar8,(char *)inValue);
          std::operator<<(poVar8," v_coords;\n");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_498,"coords",&local_499);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_380,&local_498);
          std::__cxx11::string::~string((string *)&local_498);
          std::allocator<char>::~allocator(&local_499);
        }
        if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
          local_9b8 = "v_coords";
        }
        else {
          local_9b8 = "a_coords";
        }
        std::__cxx11::string::operator=(local_408,local_9b8);
      }
    }
    else if (*(int *)precName == 1) {
      poVar8 = std::operator<<(local_7a8,"layout(std140, set = 0, binding = ");
      iVar3 = inNdx;
      inNdx = inNdx + 1;
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar3);
      poVar8 = std::operator<<(poVar8,") uniform buffer");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,in._4_4_);
      poVar8 = std::operator<<(poVar8," { ");
      poVar8 = std::operator<<(poVar8,typeName);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,(char *)inValue);
      poVar8 = std::operator<<(poVar8," u_in");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,in._4_4_);
      std::operator<<(poVar8,"; };\n");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"u_in",&local_4e1);
      de::toString<int>(&local_508,(int *)((long)&in + 4));
      std::operator+(&local_4c0,&local_4e0,&local_508);
      std::__cxx11::string::operator=(local_408,(string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_508);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::allocator<char>::~allocator(&local_4e1);
    }
    else if (*(int *)precName == 0) {
      poVar8 = std::operator<<(local_7a8,"const ");
      poVar8 = std::operator<<(poVar8,typeName);
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,(char *)inValue);
      poVar8 = std::operator<<(poVar8," in");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,in._4_4_);
      std::operator<<(poVar8," = ");
      switch(*(undefined4 *)(precName + 4)) {
      case 1:
        de::floatToString_abi_cxx11_
                  (&local_528,(de *)0x1,
                   *(float *)((long)&sr::(anonymous_namespace)::s_constInFloat + (long)in._4_4_ * 4)
                   ,precision);
        std::operator<<(local_7a8,(string *)&local_528);
        std::__cxx11::string::~string((string *)&local_528);
        break;
      case 2:
        MatrixCaseUtils::writeVectorConstructor<2>
                  (local_7a8,
                   (Vector<float,_2> *)
                   (sr::(anonymous_namespace)::s_constInVec2 + (long)in._4_4_ * 8));
        break;
      case 3:
        MatrixCaseUtils::writeVectorConstructor<3>
                  (local_7a8,
                   (Vector<float,_3> *)
                   (sr::(anonymous_namespace)::s_constInVec3 + (long)in._4_4_ * 0xc));
        break;
      case 4:
        MatrixCaseUtils::writeVectorConstructor<4>
                  (local_7a8,
                   (Vector<float,_4> *)
                   (sr::(anonymous_namespace)::s_constInVec4 + (long)in._4_4_ * 0x10));
        break;
      case 5:
        tcu::Matrix<float,_2,_2>::Matrix
                  (&local_538,
                   (float *)(sr::(anonymous_namespace)::s_constInMat2x2 + (long)in._4_4_ * 0x10));
        sr::(anonymous_namespace)::MatrixCaseUtils::writeMatrixConstructor<2,2>
                  (local_7a8,&local_538);
        tcu::Matrix<float,_2,_2>::~Matrix(&local_538);
        break;
      case 6:
        tcu::Matrix<float,_3,_2>::Matrix
                  (&local_550,
                   (float *)(sr::(anonymous_namespace)::s_constInMat2x3 + (long)in._4_4_ * 0x18));
        sr::(anonymous_namespace)::MatrixCaseUtils::writeMatrixConstructor<2,3>
                  (local_7a8,&local_550);
        tcu::Matrix<float,_3,_2>::~Matrix(&local_550);
        break;
      case 7:
        tcu::Matrix<float,_4,_2>::Matrix
                  (&local_570,
                   (float *)(sr::(anonymous_namespace)::s_constInMat2x4 + (long)in._4_4_ * 0x20));
        sr::(anonymous_namespace)::MatrixCaseUtils::writeMatrixConstructor<2,4>
                  (local_7a8,&local_570);
        tcu::Matrix<float,_4,_2>::~Matrix(&local_570);
        break;
      case 8:
        tcu::Matrix<float,_2,_3>::Matrix
                  (&local_588,
                   (float *)(sr::(anonymous_namespace)::s_constInMat3x2 + (long)in._4_4_ * 0x18));
        sr::(anonymous_namespace)::MatrixCaseUtils::writeMatrixConstructor<3,2>
                  (local_7a8,&local_588);
        tcu::Matrix<float,_2,_3>::~Matrix(&local_588);
        break;
      case 9:
        tcu::Matrix<float,_3,_3>::Matrix
                  (&local_5ac,
                   (float *)(sr::(anonymous_namespace)::s_constInMat3x3 + (long)in._4_4_ * 0x24));
        sr::(anonymous_namespace)::MatrixCaseUtils::writeMatrixConstructor<3,3>
                  (local_7a8,&local_5ac);
        tcu::Matrix<float,_3,_3>::~Matrix(&local_5ac);
        break;
      case 10:
        tcu::Matrix<float,_4,_3>::Matrix
                  (&local_5dc,
                   (float *)(sr::(anonymous_namespace)::s_constInMat3x4 + (long)in._4_4_ * 0x30));
        sr::(anonymous_namespace)::MatrixCaseUtils::writeMatrixConstructor<3,4>
                  (local_7a8,&local_5dc);
        tcu::Matrix<float,_4,_3>::~Matrix(&local_5dc);
        break;
      case 0xb:
        tcu::Matrix<float,_2,_4>::Matrix
                  (&local_5fc,
                   (float *)(sr::(anonymous_namespace)::s_constInMat4x2 + (long)in._4_4_ * 0x20));
        sr::(anonymous_namespace)::MatrixCaseUtils::writeMatrixConstructor<4,2>
                  (local_7a8,&local_5fc);
        tcu::Matrix<float,_2,_4>::~Matrix(&local_5fc);
        break;
      case 0xc:
        tcu::Matrix<float,_3,_4>::Matrix
                  (&local_62c,
                   (float *)(sr::(anonymous_namespace)::s_constInMat4x3 + (long)in._4_4_ * 0x30));
        sr::(anonymous_namespace)::MatrixCaseUtils::writeMatrixConstructor<4,3>
                  (local_7a8,&local_62c);
        tcu::Matrix<float,_3,_4>::~Matrix(&local_62c);
        break;
      case 0xd:
        tcu::Matrix<float,_4,_4>::Matrix
                  (&local_66c,
                   (float *)(sr::(anonymous_namespace)::s_constInMat4x4 + (long)in._4_4_ * 0x40));
        sr::(anonymous_namespace)::MatrixCaseUtils::writeMatrixConstructor<4,4>
                  (local_7a8,&local_66c);
        tcu::Matrix<float,_4,_4>::~Matrix(&local_66c);
      }
      std::operator<<(local_7a8,";\n");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b0,"in",&local_6b1);
      de::toString<int>((string *)&copyIter,(int *)((long)&in + 4));
      std::operator+(&local_690,&local_6b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&copyIter)
      ;
      std::__cxx11::string::operator=(local_408,(string *)&local_690);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::string::~string((string *)&copyIter);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::allocator<char>::~allocator(&local_6b1);
    }
  }
  poVar8 = std::operator<<((ostream *)local_188,"\n");
  poVar8 = std::operator<<(poVar8,"void main (void)\n");
  poVar8 = std::operator<<(poVar8,"{\n");
  std::operator<<(poVar8,"\tgl_Position = a_position;\n");
  poVar8 = std::operator<<((ostream *)local_300,"\n");
  poVar8 = std::operator<<(poVar8,"void main (void)\n");
  std::operator<<(poVar8,"{\n");
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) == 0) {
    local_6e8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_380);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_6e0,&local_6e8);
    while( true ) {
      local_6f0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_380);
      bVar1 = __gnu_cxx::operator!=(&local_6e0,&local_6f0);
      if (!bVar1) break;
      poVar8 = std::operator<<((ostream *)local_188,"\tv_");
      pbVar9 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_6e0);
      poVar8 = std::operator<<(poVar8,(string *)pbVar9);
      poVar8 = std::operator<<(poVar8," = ");
      poVar8 = std::operator<<(poVar8,"a_");
      pbVar9 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_6e0);
      poVar8 = std::operator<<(poVar8,(string *)pbVar9);
      std::operator<<(poVar8,";\n");
      local_6f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_6e0,0);
    }
  }
  else {
    std::operator<<((ostream *)local_300,"\tdEQP_FragColor = v_color;\n");
  }
  OVar5 = MatrixCaseUtils::getOperationNature(this->m_op);
  if (OVar5 == OPERATIONNATURE_PURE) {
    std::__cxx11::string::operator=
              ((string *)(operationValue1.field_2._M_local_buf + 8),
               (string *)(inValue1.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)&matrixType,(string *)&resultPrec);
  }
  else if (OVar5 == OPERATIONNATURE_MUTATING) {
    poVar8 = std::operator<<(local_7a8,"\t");
    pcVar7 = glu::getPrecisionName
                       ((Precision)
                        passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    pcVar7 = glu::getDataTypeName
                       (passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," tmpValue = ");
    poVar8 = std::operator<<(poVar8,(string *)(inValue1.field_2._M_local_buf + 8));
    std::operator<<(poVar8,";\n");
    std::__cxx11::string::operator=((string *)(operationValue1.field_2._M_local_buf + 8),"tmpValue")
    ;
    std::__cxx11::string::operator=((string *)&matrixType,(string *)&resultPrec);
  }
  else if (OVar5 == OPERATIONNATURE_ASSIGNMENT) {
    std::__cxx11::string::operator=
              ((string *)(operationValue1.field_2._M_local_buf + 8),
               (string *)(inValue1.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=((string *)&matrixType,(string *)&resultPrec);
  }
  OVar6 = MatrixCaseUtils::getOperationType(this->m_op);
  switch(OVar6) {
  case OPERATIONTYPE_BINARY_OPERATOR:
    poVar8 = std::operator<<(local_7a8,"\t");
    pcVar7 = glu::getPrecisionName
                       ((Precision)
                        passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    pcVar7 = glu::getDataTypeName
                       (passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," res = ");
    poVar8 = std::operator<<(poVar8,(string *)(operationValue1.field_2._M_local_buf + 8));
    poVar8 = std::operator<<(poVar8," ");
    pcVar7 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,(string *)&matrixType);
    std::operator<<(poVar8,";\n");
    break;
  case OPERATIONTYPE_BINARY_FUNCTION:
    poVar8 = std::operator<<(local_7a8,"\t");
    pcVar7 = glu::getPrecisionName
                       ((Precision)
                        passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    pcVar7 = glu::getDataTypeName
                       (passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," res = ");
    pcVar7 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8,"(");
    poVar8 = std::operator<<(poVar8,(string *)(operationValue1.field_2._M_local_buf + 8));
    poVar8 = std::operator<<(poVar8,", ");
    poVar8 = std::operator<<(poVar8,(string *)&matrixType);
    std::operator<<(poVar8,");\n");
    break;
  case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
    poVar8 = std::operator<<(local_7a8,"\t");
    pcVar7 = glu::getPrecisionName
                       ((Precision)
                        passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    pcVar7 = glu::getDataTypeName
                       (passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," res = ");
    pcVar7 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8,(string *)(operationValue1.field_2._M_local_buf + 8));
    std::operator<<(poVar8,";\n");
    break;
  case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
    poVar8 = std::operator<<(local_7a8,"\t");
    pcVar7 = glu::getPrecisionName
                       ((Precision)
                        passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    pcVar7 = glu::getDataTypeName
                       (passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," res = ");
    poVar8 = std::operator<<(poVar8,(string *)(operationValue1.field_2._M_local_buf + 8));
    pcVar7 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar8 = std::operator<<(poVar8,pcVar7);
    std::operator<<(poVar8,";\n");
    break;
  case OPERATIONTYPE_UNARY_FUNCTION:
    poVar8 = std::operator<<(local_7a8,"\t");
    pcVar7 = glu::getPrecisionName
                       ((Precision)
                        passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    pcVar7 = glu::getDataTypeName
                       (passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," res = ");
    pcVar7 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8,"(");
    poVar8 = std::operator<<(poVar8,(string *)(operationValue1.field_2._M_local_buf + 8));
    std::operator<<(poVar8,");\n");
    break;
  case OPERATIONTYPE_ASSIGNMENT:
    poVar8 = std::operator<<(local_7a8,"\t");
    pcVar7 = glu::getPrecisionName
                       ((Precision)
                        passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    pcVar7 = glu::getDataTypeName
                       (passVars.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," res = ");
    poVar8 = std::operator<<(poVar8,(string *)(operationValue1.field_2._M_local_buf + 8));
    std::operator<<(poVar8,";\n");
    poVar8 = std::operator<<(local_7a8,"\tres ");
    pcVar7 = MatrixCaseUtils::getOperationName(this->m_op);
    poVar8 = std::operator<<(poVar8,pcVar7);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,(string *)&matrixType);
    std::operator<<(poVar8,";\n");
  }
  poVar8 = std::operator<<(local_7a8,"\t");
  pcVar7 = "dEQP_FragColor";
  if (((this->super_ShaderRenderCase).m_isVertexCase & 1U) != 0) {
    pcVar7 = "v_color";
  }
  poVar8 = std::operator<<(poVar8,pcVar7);
  std::operator<<(poVar8," = ");
  bVar1 = MatrixCaseUtils::isOperationValueModifying(this->m_op);
  if (bVar1) {
    poVar8 = std::operator<<(local_7a8,"vec4(");
    sr::(anonymous_namespace)::ShaderMatrixCase::genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_718,this,
               (DataType *)
               ((long)&passVars.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),"res");
    poVar8 = std::operator<<(poVar8,(string *)&local_718);
    poVar8 = std::operator<<(poVar8,", 1.0) + vec4(");
    sr::(anonymous_namespace)::ShaderMatrixCase::genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_738,this,
               (DataType *)
               ((long)&passVars.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),"tmpValue");
    poVar8 = std::operator<<(poVar8,(string *)&local_738);
    std::operator<<(poVar8,", 0.0);\n");
    std::__cxx11::string::~string((string *)&local_738);
    std::__cxx11::string::~string((string *)&local_718);
  }
  else {
    poVar8 = std::operator<<(local_7a8,"vec4(");
    sr::(anonymous_namespace)::ShaderMatrixCase::genGLSLMatToVec3Reduction_abi_cxx11_
              (&local_758,this,
               (DataType *)
               ((long)&passVars.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),"res");
    poVar8 = std::operator<<(poVar8,(string *)&local_758);
    std::operator<<(poVar8,", 1.0);\n");
    std::__cxx11::string::~string((string *)&local_758);
  }
  std::operator<<((ostream *)local_188,"}\n");
  std::operator<<((ostream *)local_300,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,local_778);
  std::__cxx11::string::~string(local_778);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,local_798);
  std::__cxx11::string::~string(local_798);
  std::__cxx11::string::~string((string *)&matrixType);
  std::__cxx11::string::~string((string *)(operationValue1.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_380);
  std::__cxx11::string::~string((string *)&resultPrec);
  std::__cxx11::string::~string((string *)(inValue1.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_300);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void ShaderMatrixCase::setupShader (void)
{
	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op				= m_isVertexCase ? vtx : frag;

	bool				isInDynMat0		= isDataTypeMatrix(m_in0.dataType) && m_in0.inputType == INPUTTYPE_DYNAMIC;
	bool				isInDynMat1		= isDataTypeMatrix(m_in1.dataType) && m_in1.inputType == INPUTTYPE_DYNAMIC;
	string				inValue0;
	string				inValue1;
	DataType			resultType		= TYPE_LAST;
	Precision			resultPrec		= m_in0.precision;
	vector<string>		passVars;
	int					numInputs		= (isOperationBinary(m_op)) ? (2) : (1);

	std::string			operationValue0;
	std::string			operationValue1;

	DE_ASSERT(!isInDynMat0 || !isInDynMat1); // Only single dynamic matrix input is allowed.
	DE_UNREF(isInDynMat0 && isInDynMat1);

	// Compute result type.
	if (m_op == OP_MUL && isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		resultType = getDataTypeMatrix(getDataTypeMatrixNumColumns(m_in1.dataType), getDataTypeMatrixNumRows(m_in0.dataType));
	}
	else if (m_op == OP_OUTER_PRODUCT)
	{
		resultType = getDataTypeMatrix(getDataTypeScalarSize(m_in1.dataType), getDataTypeScalarSize(m_in0.dataType));
	}
	else if (m_op == OP_TRANSPOSE)
	{
		resultType = getDataTypeMatrix(getDataTypeMatrixNumRows(m_in0.dataType), getDataTypeMatrixNumColumns(m_in0.dataType));
	}
	else if (m_op == OP_INVERSE)
	{
		resultType = m_in0.dataType;
	}
	else if (m_op == OP_DETERMINANT)
	{
		resultType = TYPE_FLOAT;
	}
	else if (getOperationType(m_op) == OPERATIONTYPE_UNARY_PREFIX_OPERATOR ||
			 getOperationType(m_op) == OPERATIONTYPE_UNARY_POSTFIX_OPERATOR)
	{
		resultType = m_in0.dataType;
	}
	else if (isDataTypeMatrix(m_in0.dataType) && isDataTypeMatrix(m_in1.dataType))
	{
		DE_ASSERT(m_in0.dataType == m_in1.dataType);
		resultType = m_in0.dataType;
	}
	else if (isDataTypeMatrix(m_in0.dataType) || isDataTypeMatrix(m_in1.dataType))
	{
		int			matNdx		= isDataTypeMatrix(m_in0.dataType) ? 0 : 1;
		DataType	matrixType	= matNdx == 0 ? m_in0.dataType : m_in1.dataType;
		DataType	otherType	= matNdx == 0 ? m_in1.dataType : m_in0.dataType;

		if (otherType == TYPE_FLOAT)
			resultType = matrixType;
		else
		{
			DE_ASSERT(isDataTypeVector(otherType));
			resultType = getDataTypeFloatVec(matNdx == 0 ? getDataTypeMatrixNumRows(matrixType) : getDataTypeMatrixNumColumns(matrixType));
		}
	}
	else
	{
		DE_ASSERT(DE_FALSE);
	}

	static const std::string header =
		"#version 310 es\n";

	vtx << header;
	frag << header;

	vtx << "layout(location = 0) in highp vec4 a_position;\n";
	frag << "layout(location = 0) out mediump vec4 dEQP_FragColor;\n";
	if (m_isVertexCase)
	{
		vtx << "layout(location = 0) out mediump vec4 v_color;\n";
		frag << "layout(location = 0) in mediump vec4 v_color;\n";
	}

	// Input declarations.
	deUint32 uniformBinding = 0;
	deUint32 padding = 0;
	for (int inNdx = 0; inNdx < numInputs; inNdx++)
	{
		const ShaderInput&	in			= inNdx > 0 ? m_in1 : m_in0;
		const char*			precName	= getPrecisionName(in.precision);
		const char*			typeName	= getDataTypeName(in.dataType);
		string&				inValue		= inNdx > 0 ? inValue1 : inValue0;

		if (in.inputType == INPUTTYPE_DYNAMIC)
		{
			if (isDataTypeMatrix(in.dataType))
			{
				vtx << "layout(location = " << 4 + inNdx + padding << ") in " << precName << " " << typeName << " a_";
				// a_matN, v_matN
				vtx << typeName << ";\n";
				if (!m_isVertexCase)
				{
					vtx << "layout(location = " << 1 + inNdx + padding << ") out " << precName << " " << typeName << " v_" << typeName << ";\n";
					frag << "layout(location = " << 1 + inNdx + padding << ") in " << precName << " " << typeName << " v_" << typeName << ";\n";
					passVars.push_back(typeName);
				}

				inValue = string(m_isVertexCase ? "a_" : "v_") + getDataTypeName(in.dataType);
				padding += getDataTypeMatrixNumColumns(in.dataType);
			}
			else
			{
				// a_coords, v_coords
				vtx << "layout(location = 1) in " << precName << " " << typeName << " a_coords;\n";
				if (!m_isVertexCase)
				{
					vtx << "layout(location = " << 1 + padding << ") out " << precName << " " << typeName << " v_coords;\n";
					frag << "layout(location = " << 1 + padding << ") in " << precName << " " << typeName << " v_coords;\n";
					passVars.push_back("coords");
				}

				inValue = m_isVertexCase ? "a_coords" : "v_coords";
			}
		}
		else if (in.inputType == INPUTTYPE_UNIFORM)
		{
			op << "layout(std140, set = 0, binding = " << uniformBinding++ <<  ") uniform buffer"<< inNdx <<" { " << precName << " " << typeName << " u_in" << inNdx << "; };\n";
			inValue = string("u_in") + de::toString(inNdx);
		}
		else if (in.inputType == INPUTTYPE_CONST)
		{
			op << "const " << precName << " " << typeName << " in" << inNdx << " = ";

			// Generate declaration.
			switch (in.dataType)
			{
				case TYPE_FLOAT:		op << de::floatToString(s_constInFloat[inNdx], 1);					break;
				case TYPE_FLOAT_VEC2:	writeVectorConstructor<2>(op, s_constInVec2[inNdx]);				break;
				case TYPE_FLOAT_VEC3:	writeVectorConstructor<3>(op, s_constInVec3[inNdx]);				break;
				case TYPE_FLOAT_VEC4:	writeVectorConstructor<4>(op, s_constInVec4[inNdx]);				break;
				case TYPE_FLOAT_MAT2:	writeMatrixConstructor<2, 2>(op, Mat2(s_constInMat2x2[inNdx]));		break;
				case TYPE_FLOAT_MAT2X3:	writeMatrixConstructor<2, 3>(op, Mat2x3(s_constInMat2x3[inNdx]));	break;
				case TYPE_FLOAT_MAT2X4:	writeMatrixConstructor<2, 4>(op, Mat2x4(s_constInMat2x4[inNdx]));	break;
				case TYPE_FLOAT_MAT3X2:	writeMatrixConstructor<3, 2>(op, Mat3x2(s_constInMat3x2[inNdx]));	break;
				case TYPE_FLOAT_MAT3:	writeMatrixConstructor<3, 3>(op, Mat3(s_constInMat3x3[inNdx]));		break;
				case TYPE_FLOAT_MAT3X4:	writeMatrixConstructor<3, 4>(op, Mat3x4(s_constInMat3x4[inNdx]));	break;
				case TYPE_FLOAT_MAT4X2:	writeMatrixConstructor<4, 2>(op, Mat4x2(s_constInMat4x2[inNdx]));	break;
				case TYPE_FLOAT_MAT4X3:	writeMatrixConstructor<4, 3>(op, Mat4x3(s_constInMat4x3[inNdx]));	break;
				case TYPE_FLOAT_MAT4:	writeMatrixConstructor<4, 4>(op, Mat4(s_constInMat4x4[inNdx]));		break;

				default:
					DE_ASSERT(DE_FALSE);
			}

			op << ";\n";

			inValue = string("in") + de::toString(inNdx);
		}
	}

	vtx << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\n"
		 << "void main (void)\n"
		 << "{\n";

	if (m_isVertexCase)
		frag << "	dEQP_FragColor = v_color;\n";
	else
	{
		for (vector<string>::const_iterator copyIter = passVars.begin(); copyIter != passVars.end(); copyIter++)
			vtx << "	v_" << *copyIter << " = " << "a_" << *copyIter << ";\n";
	}

	// Operation.

	switch (getOperationNature(m_op))
	{
		case OPERATIONNATURE_PURE:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_MUTATING:
			DE_ASSERT(getOperationType(m_op) != OPERATIONTYPE_ASSIGNMENT);

			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " tmpValue = " << inValue0 << ";\n";

			operationValue0 = "tmpValue";
			operationValue1 = inValue1;
			break;

		case OPERATIONNATURE_ASSIGNMENT:
			DE_ASSERT(getOperationType(m_op) == OPERATIONTYPE_ASSIGNMENT);

			operationValue0 = inValue0;
			operationValue1 = inValue1;
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	switch (getOperationType(m_op))
	{
		case OPERATIONTYPE_BINARY_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << " " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_PREFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << operationValue0 << ";\n";
			break;

		case OPERATIONTYPE_UNARY_POSTFIX_OPERATOR:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << getOperationName(m_op) << ";\n";
			break;

		case OPERATIONTYPE_BINARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ", " << operationValue1 << ");\n";
			break;

		case OPERATIONTYPE_UNARY_FUNCTION:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << getOperationName(m_op) << "(" << operationValue0 << ");\n";
			break;

		case OPERATIONTYPE_ASSIGNMENT:
			op << "	" << getPrecisionName(resultPrec) << " " << getDataTypeName(resultType) << " res = " << operationValue0 << ";\n";
			op << "	res " << getOperationName(m_op) << " " << operationValue1 << ";\n";
			break;

		default:
			DE_ASSERT(DE_FALSE);
	}

	// Reduction to vec3 (rgb). Check the used value too if it was modified
	op << "	" << (m_isVertexCase ? "v_color" : "dEQP_FragColor") << " = ";

	if (isOperationValueModifying(m_op))
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0) + vec4(" << genGLSLMatToVec3Reduction(resultType, "tmpValue") << ", 0.0);\n";
	else
		op << "vec4(" << genGLSLMatToVec3Reduction(resultType, "res") << ", 1.0);\n";

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource	= vtx.str();
	m_fragShaderSource	= frag.str();
}